

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O3

Amap_Obj_t * Amap_ManCreateAnd(Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1)

{
  uint uVar1;
  Amap_Obj_t *pAVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  
  pAVar2 = Amap_ManSetupObj(p);
  *(ulong *)pAVar2 = *(ulong *)pAVar2 & 0xfffffffffffffff8 | 4;
  puVar4 = (uint *)((ulong)pFan0 & 0xfffffffffffffffe);
  pAVar2->Fan[0] = ((uint)pFan0 & 1) + (*puVar4 >> 3) * 2;
  puVar4[4] = puVar4[4] + 1;
  puVar6 = (uint *)((ulong)pFan1 & 0xfffffffffffffffe);
  pAVar2->Fan[1] = ((uint)pFan1 & 1) + (*puVar6 >> 3) * 2;
  puVar6[4] = puVar6[4] + 1;
  if ((pAVar2->Fan[0] < 0) || (pAVar2->Fan[1] < 0)) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if ((uint)(pAVar2->Fan[1] ^ pAVar2->Fan[0]) < 2) {
    __assert_fail("Abc_Lit2Var(pObj->Fan[0]) != Abc_Lit2Var(pObj->Fan[1])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                  ,0x90,"Amap_Obj_t *Amap_ManCreateAnd(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
  }
  *(ulong *)pAVar2 =
       *(ulong *)pAVar2 & 0xdfffffffffffffff |
       (ulong)(((uint)((ulong)*(undefined8 *)puVar6 >> 0x3d) ^ (uint)pFan1) &
               ((uint)((ulong)*(undefined8 *)puVar4 >> 0x3d) ^ (uint)pFan0) & 1) << 0x3d;
  uVar1 = puVar6[2];
  if ((int)puVar6[2] < (int)puVar4[2]) {
    uVar1 = puVar4[2];
  }
  uVar3 = uVar1 + 1;
  pAVar2->Level = uVar3;
  uVar5 = p->nLevelMax;
  if (p->nLevelMax <= (int)uVar1) {
    p->nLevelMax = uVar3;
    uVar5 = uVar3;
  }
  if ((int)uVar5 < 0xffe) {
    p->nObjs[4] = p->nObjs[4] + 1;
    return pAVar2;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0x95,"Amap_Obj_t *Amap_ManCreateAnd(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreateAnd( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->Type   = AMAP_OBJ_AND;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Fan[1] = Amap_ObjToLit(pFan1);  Amap_Regular(pFan1)->nRefs++;
    assert( Abc_Lit2Var(pObj->Fan[0]) != Abc_Lit2Var(pObj->Fan[1]) );
    pObj->fPhase = Amap_ObjPhaseReal(pFan0) & Amap_ObjPhaseReal(pFan1);
    pObj->Level  = 1 + Abc_MaxInt( Amap_Regular(pFan0)->Level, Amap_Regular(pFan1)->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_AND]++;
    return pObj;
}